

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgen.c
# Opt level: O1

int main(int ac,char **av)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  FILE *pFVar4;
  long (*in_RCX) [22];
  long nHigh;
  int iVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  long *plVar9;
  long lVar10;
  char qname [10];
  char line [512];
  char local_242 [10];
  char local_238 [520];
  
  prog = *av;
  flt_scale = 1.0;
  flags = 0;
  d_path = (char *)0x0;
  process_options(ac,av);
  if ((flags & 0x10U) != 0) {
    in_RCX = (long (*) [22])0x1;
    fprintf(_stdout,"-- TPC %s Parameter Substitution (Version %d.%d.%d%s)\n",
            "SSB (Star Schema Benchmark)",1,0,0,"");
  }
  setup();
  if ((flags & 1U) == 0) {
    if (((uint)flags >> 10 & 1) == 0) {
      uVar3 = time((time_t *)0x0);
      rndm = uVar3 & 0xffffffff;
    }
    if (rndm < 0) {
      rndm = rndm + 0x7fffffff;
    }
    Seed[0].value = rndm;
    lVar10 = 0x28;
    do {
      Seed[0].value = NextRand(Seed[0].value);
      *(long *)((long)&Seed[0].table + lVar10) = Seed[0].value;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x2e8);
    printf("-- using %ld as a seed to the RNG\n",rndm);
  }
  else {
    puts("-- using default substitutions");
  }
  if ((flags & 0x1000U) != 0) {
    pcVar8 = "r";
    plVar9 = (long *)ifile;
    pFVar4 = fopen64(ifile,"r");
    if (pFVar4 == (FILE *)0x0) {
      main_cold_1();
      goto LAB_001052b6;
    }
    pcVar8 = fgets(local_238,0x200,pFVar4);
    if (pcVar8 != (char *)0x0) {
      do {
        fputs(local_238,_stdout);
        pcVar8 = fgets(local_238,0x200,pFVar4);
      } while (pcVar8 != (char *)0x0);
    }
  }
  lVar10 = (long)_optind;
  if (snum < 0) {
    if (_optind < ac) {
      iVar5 = ac - _optind;
      lVar7 = 0;
      do {
        qsub(av[lVar10 + lVar7],flags);
        lVar7 = lVar7 + 1;
      } while (iVar5 != (int)lVar7);
    }
    else {
      uVar3 = 1;
      do {
        sprintf(local_242,"%d",uVar3);
        qsub(local_242,flags);
        uVar6 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar6;
      } while (uVar6 != 0x17);
    }
  }
  else if (_optind < ac) {
    iVar5 = ac - _optind;
    lVar7 = 0;
    do {
      iVar1 = snum % 0x29;
      iVar2 = atoi(av[lVar10 + lVar7]);
      in_RCX = permutation + iVar1;
      sprintf(local_242,"%ld",*(undefined8 *)((long)iVar1 * 0xb0 + 0x10b528 + (long)iVar2 * 8));
      qsub(local_242,flags);
      lVar7 = lVar7 + 1;
    } while (iVar5 != (int)lVar7);
  }
  else {
    lVar10 = 0;
    do {
      in_RCX = (long (*) [22])(ulong)(uint)((snum / 0x29) * 0x29);
      sprintf(local_242,"%ld",*(undefined8 *)((long)permutation[snum % 0x29] + lVar10));
      qsub(local_242,flags);
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0xb0);
  }
  if ((flags & 0x2000U) != 0) {
    pcVar8 = "r";
    plVar9 = (long *)tfile;
    pFVar4 = fopen64(tfile,"r");
    if (pFVar4 == (FILE *)0x0) {
LAB_001052b6:
      main_cold_2();
      lVar10 = UnifInt((long)pcVar8,nHigh,(long)in_RCX);
      *plVar9 = lVar10;
      Seed[(long)in_RCX].usage = Seed[(long)in_RCX].usage + 1;
      return 0x10d170;
    }
    pcVar8 = fgets(local_238,0x200,pFVar4);
    if (pcVar8 != (char *)0x0) {
      do {
        fputs(local_238,_stdout);
        pcVar8 = fgets(local_238,0x200,pFVar4);
      } while (pcVar8 != (char *)0x0);
    }
  }
  return 0;
}

Assistant:

int main(int ac, char **av)
{
    int i;
    FILE *ifp;
    char line[LINE_SIZE];

    prog = av[0];
    flt_scale = (double)1.0;
    flags = 0;
	d_path = NULL;
    process_options(ac, av);
    if (flags & VERBOSE)
        fprintf(ofp, 
	    "-- TPC %s Parameter Substitution (Version %d.%d.%d%s)\n",
            NAME, VERSION, RELEASE, MODIFICATION, PATCH);

    setup();

    if (!(flags & DFLT))        /* perturb the RNG */
	    {
	    if (!(flags & SEED))
            {
			/* Note:
			 * The multiplication by the process ID is a change in ssb-dbgen relative to TPC-H dbgen 
			 */
            rndm = (long)((unsigned)time(NULL) * DSS_PROC);
            }
		if (rndm < 0)
			rndm += 2147483647;
		Seed[0].value = rndm;
		for (i=1; i <= QUERIES_PER_SET; i++)
			{
			Seed[0].value = NextRand(Seed[0].value);
			Seed[i].value = Seed[0].value;
			}
		printf("-- using %ld as a seed to the RNG\n", rndm);
		}
    else
        printf("-- using default substitutions\n");
    
    if (flags & INIT)           /* init stream with ifile */
        {
        ifp = fopen(ifile, "r");
	OPEN_CHECK(ifp, ifile);
        while (fgets(line, LINE_SIZE, ifp) != NULL)
            fprintf(stdout, "%s", line);
        }

    if (snum >= 0)
        if (optind < ac)
            for (i=optind; i < ac; i++)
                {
                char qname[10];
                sprintf(qname, "%ld", SEQUENCE(snum, atoi(av[i])));
                qsub(qname, flags);
                }
        else
            for (i=1; i <= QUERIES_PER_SET; i++)
                {
                char qname[10];
                sprintf(qname, "%ld", SEQUENCE(snum, i));
                qsub(qname, flags);
                }
    else
        if (optind < ac)
            for (i=optind; i < ac; i++)
                qsub(av[i], flags);   
        else
            for (i=1; i <= QUERIES_PER_SET; i++)
                {
                char qname[10];
                sprintf(qname, "%d", i);
                qsub(qname, flags);
                }
    
    if (flags & TERMINATE)      /* terminate stream with tfile */
        {
        ifp = fopen(tfile, "r");
        if (ifp == NULL)
	OPEN_CHECK(ifp, tfile);
        while (fgets(line, LINE_SIZE, ifp) != NULL)
            fprintf(stdout, "%s", line);
        }

    return(0);
}